

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O2

shared_ptr<Face> __thiscall Pyraminx::get_opposite_face(Pyraminx *this,Corner corner)

{
  long lVar1;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<Face> sVar2;
  
  lVar1 = 0x18;
  if (in_EDX < 4) {
    lVar1 = (ulong)in_EDX * -0x10 + 0x48;
  }
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)
             (CONCAT44(in_register_00000034,corner) + lVar1));
  sVar2.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Face>)sVar2.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Face> Pyraminx::get_opposite_face(Corner corner){
    switch (corner)
    {
    case Corner::U:
        return green_face;
        break;
    case Corner::L:
        return yellow_face;
        break;
    case Corner::R:
        return red_face;
        break;
    case Corner::B:
        return blue_face;
        break;
    default:
        return blue_face;
        printf("Invalid corner specified.\n");
        break;
    }
}